

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O2

double trng::math::detail::inv_erfc<double>(double x)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  uVar1 = -(ulong)(1.0 < x);
  dVar5 = (double)(~uVar1 & (ulong)x | (ulong)(1.0 - (x + -1.0)) & uVar1);
  dVar2 = inv_Phi_approx<double>(dVar5 * 0.5);
  dVar2 = dVar2 * -0.7071067811865476;
  if ((long)ABS(dVar2) < 0x7ff0000000000000) {
    dVar3 = erfc(dVar2);
    dVar4 = exp(dVar2 * dVar2);
    dVar4 = dVar4 * (dVar3 - dVar5) * -0.886226925452758;
    dVar2 = dVar2 - dVar4 / (dVar2 * dVar4 + 1.0);
  }
  return (double)(~uVar1 & (ulong)dVar2 | (ulong)-dVar2 & uVar1);
}

Assistant:

TRNG_CUDA_ENABLE T inv_erfc(T x) {
        // step size in the Halley step is proportional to erfc, use symmetry to increase
        // numerical accuracy
        const bool flag{x > 1};
        if (flag)
          x = -(x - 1) + 1;
        T y{-inv_Phi_approx(x / 2) * constants<T>::one_over_sqrt_2};
        // refinement by Halley rational method
        if (isfinite(y)) {
          const T e{erfc(y) - x};
          const T u{-e * (constants<T>::sqrt_pi_over_2) * exp(y * y)};
          y -= u / (1 + y * u);
        }
        // T is a floating point number type with more than 80 bits, a 2nd iteration is
        // required to reach full machine precision
#if __cplusplus >= 201703L
        if constexpr (sizeof(T) > 10) {
#else
#if _MSC_VER
#pragma warning(push)
#pragma warning(disable : 4127)
#endif
        if (sizeof(T) > 10) {
#if _MSC_VER
#pragma warning(pop)
#endif
#endif
          if (isfinite(y)) {
            const T e{erfc(y) - x};
            const T u{-e * (constants<T>::sqrt_pi_over_2) * exp(y * y)};
            y -= u / (1 + y * u);
          }
        }
        return flag ? -y : y;
      }

    }